

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1500.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  undefined8 uVar8;
  timeval tVar9;
  undefined8 uStack_40;
  int still_running;
  int num;
  
  _still_running = in_RAX;
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar8 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar8,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1500.c"
                  ,0x29,iVar1,uVar3);
    goto LAB_0010145e;
  }
  lVar4 = curl_multi_init();
  if (lVar4 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1500.c"
                  ,0x2b);
    iVar2 = 0x7b;
LAB_00101389:
    iVar1 = 0x77;
  }
  else {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      lVar5 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1500.c"
                    ,0x2d);
      iVar2 = 0x7c;
      goto LAB_00101389;
    }
    iVar2 = curl_easy_setopt(lVar5,0x2712,URL);
    uVar8 = _stderr;
    if (iVar2 == 0) {
      iVar2 = curl_easy_setopt(lVar5,0x2a,1);
      uVar8 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_40 = 0x30;
        goto LAB_0010142e;
      }
      iVar2 = curl_multi_add_handle(lVar4,lVar5);
      uVar8 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_multi_strerror(iVar2);
        pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_40 = 0x32;
        goto LAB_0010142e;
      }
      iVar2 = curl_multi_perform(lVar4,&still_running);
      uVar8 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_multi_strerror(iVar2);
        pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
        uStack_40 = 0x34;
        goto LAB_0010142e;
      }
      if (still_running < 0) {
        curl_mfprintf(_stderr,
                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1500.c"
                      ,0x34);
        iVar2 = 0x7a;
        goto LAB_00101389;
      }
      tVar9 = tutil_tvnow();
      lVar6 = tutil_tvdiff(tVar9,tv_test_start);
      if (60000 < lVar6) {
        curl_mfprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1500.c"
                      ,0x36);
        iVar2 = 0x7d;
        goto LAB_00101389;
      }
      do {
        if (still_running == 0) {
          lVar6 = curl_multi_info_read(lVar4,&still_running);
          iVar2 = 0;
          if (lVar6 == 0) goto LAB_0010143f;
          iVar1 = *(int *)(lVar6 + 0x10);
          goto LAB_00101443;
        }
        iVar1 = curl_multi_wait(lVar4,0,0,60000,&num);
        if (iVar1 != 0) {
          curl_mprintf("curl_multi_wait() returned %d\n",iVar1);
          iVar2 = 0x7e;
          goto LAB_0010143f;
        }
        tVar9 = tutil_tvnow();
        lVar6 = tutil_tvdiff(tVar9,tv_test_start);
        if (60000 < lVar6) {
          uStack_40 = 0x41;
          goto LAB_00101606;
        }
        iVar2 = curl_multi_perform(lVar4,&still_running);
        uVar8 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uStack_40 = 0x43;
          goto LAB_0010142e;
        }
        if (still_running < 0) {
          curl_mfprintf(_stderr,
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1500.c"
                        ,0x43);
          iVar2 = 0x7a;
          goto LAB_0010143f;
        }
        tVar9 = tutil_tvnow();
        lVar6 = tutil_tvdiff(tVar9,tv_test_start);
      } while (lVar6 < 0xea61);
      uStack_40 = 0x45;
LAB_00101606:
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1500.c"
                    ,uStack_40);
      iVar2 = 0x7d;
    }
    else {
      uVar3 = curl_easy_strerror(iVar2);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uStack_40 = 0x2f;
LAB_0010142e:
      curl_mfprintf(uVar8,pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DarovskikhAndrei[P]curl/tests/libtest/lib1500.c"
                    ,uStack_40,iVar2,uVar3);
    }
LAB_0010143f:
    iVar1 = 0x77;
  }
LAB_00101443:
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
  if (iVar2 != 0) {
    iVar1 = iVar2;
  }
LAB_0010145e:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = TEST_ERR_FAILURE;
  int res = 0;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    int num;
    res = curl_multi_wait(multi, NULL, 0, TEST_HANG_TIMEOUT, &num);
    if(res != CURLM_OK) {
      printf("curl_multi_wait() returned %d\n", res);
      res = TEST_ERR_MAJOR_BAD;
      goto test_cleanup;
    }

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}